

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O2

Vec3<float> __thiscall
Imath_3_2::closestPointOnBox<float>
          (Imath_3_2 *this,Vec3<float> *p,Box<Imath_3_2::Vec3<float>_> *box)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  uint uVar9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar10;
  float in_XMM1_Da;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Vec3<float> VVar16;
  
  bVar8 = Box<Imath_3_2::Vec3<float>_>::isEmpty(box);
  if (bVar8) {
    *(undefined8 *)this = *(undefined8 *)p;
    fVar3 = p->z;
    *(float *)(this + 8) = fVar3;
    fVar10 = 0.0;
  }
  else {
    VVar16 = clip<Imath_3_2::Vec3<float>>(p,box);
    in_XMM1_Da = VVar16.z;
    bVar8 = Vec3<float>::operator==((Vec3<float> *)this,p);
    fVar3 = extraout_XMM0_Da;
    fVar10 = extraout_XMM0_Db;
    if (bVar8) {
      fVar10 = (box->min).z;
      fVar1 = (box->max).z;
      fVar12 = fVar1 - p->z;
      in_XMM1_Da = p->z - fVar10;
      uVar2 = p->x;
      uVar5 = p->y;
      fVar3 = (box->min).x;
      uVar6 = (box->min).y;
      uVar4 = (box->max).x;
      uVar7 = (box->max).y;
      fVar11 = (float)uVar5 - (float)uVar6;
      auVar14._4_4_ = fVar11;
      auVar14._0_4_ = (float)uVar2 - fVar3;
      auVar14._8_8_ = 0;
      auVar15._4_4_ = (float)uVar7 - (float)uVar5;
      auVar15._0_4_ = (float)uVar4 - (float)uVar2;
      auVar15._8_8_ = 0;
      auVar15 = minps(auVar14,auVar15);
      fVar13 = in_XMM1_Da;
      if (fVar12 <= in_XMM1_Da) {
        fVar13 = fVar12;
      }
      if ((auVar15._4_4_ <= auVar15._0_4_) || (fVar13 <= auVar15._0_4_)) {
        if (fVar13 <= auVar15._4_4_) {
          in_XMM1_Da = (float)(~-(uint)(in_XMM1_Da < fVar12) & (uint)fVar1 |
                              (uint)fVar10 & -(uint)(in_XMM1_Da < fVar12));
          *(float *)(this + 8) = in_XMM1_Da;
          fVar10 = (float)uVar6;
        }
        else {
          fVar3 = (float)uVar6;
          if ((float)uVar7 - (float)uVar5 <= fVar11) {
            fVar3 = (float)uVar7;
          }
          *(float *)(this + 4) = fVar3;
          fVar10 = fVar3;
        }
      }
      else {
        uVar9 = -(uint)((float)uVar2 - fVar3 < (float)uVar4 - (float)uVar2);
        fVar3 = (float)((uint)fVar3 & uVar9);
        *(uint *)this = ~uVar9 & uVar4 | (uint)fVar3;
        fVar10 = (float)(uVar6 & (uint)fVar11);
      }
    }
  }
  VVar16.y = fVar10;
  VVar16.x = fVar3;
  VVar16.z = in_XMM1_Da;
  return VVar16;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Vec3<T>
closestPointOnBox (const Vec3<T>& p, const Box<Vec3<T>>& box) IMATH_NOEXCEPT
{
    if (box.isEmpty ()) return p;

    Vec3<T> q = closestPointInBox (p, box);

    if (q == p)
    {
        Vec3<T> d1 = p - box.min;
        Vec3<T> d2 = box.max - p;

        Vec3<T> d (
            (d1.x < d2.x) ? d1.x : d2.x,
            (d1.y < d2.y) ? d1.y : d2.y,
            (d1.z < d2.z) ? d1.z : d2.z);

        if (d.x < d.y && d.x < d.z)
        {
            q.x = (d1.x < d2.x) ? box.min.x : box.max.x;
        }
        else if (d.y < d.z)
        {
            q.y = (d1.y < d2.y) ? box.min.y : box.max.y;
        }
        else
        {
            q.z = (d1.z < d2.z) ? box.min.z : box.max.z;
        }
    }

    return q;
}